

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

bool __thiscall soul::Value::PackedData::StructIterator::next(StructIterator *this)

{
  ulong index;
  ulong uVar1;
  Member *this_00;
  uint64_t uVar2;
  
  index = this->index;
  uVar1 = this->numMembers;
  if (index < uVar1) {
    this->member = this->member + this->memberSize;
    this->index = index + 1;
    this_00 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                        (&this->structure->members,index);
    uVar2 = Type::getPackedSizeInBytes(&this_00->type);
    this->memberSize = uVar2;
  }
  return index < uVar1;
}

Assistant:

bool next()
        {
            if (index >= numMembers)
                return false;

            member += memberSize;
            memberSize = (size_t) structure.getMemberType (index++).getPackedSizeInBytes();
            return true;
        }